

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O0

Mem_Step_t * Mem_StepStart(int nSteps)

{
  Mem_Step_t *__s;
  Mem_Fixed_t **ppMVar1;
  Mem_Fixed_t *pMVar2;
  int local_20;
  int local_1c;
  int k;
  int i;
  Mem_Step_t *p;
  int nSteps_local;
  
  __s = (Mem_Step_t *)malloc(0x30);
  memset(__s,0,0x30);
  __s->nMems = nSteps;
  ppMVar1 = (Mem_Fixed_t **)malloc((long)__s->nMems << 3);
  __s->pMems = ppMVar1;
  for (local_1c = 0; local_1c < __s->nMems; local_1c = local_1c + 1) {
    pMVar2 = Mem_FixedStart(8 << ((byte)local_1c & 0x1f));
    __s->pMems[local_1c] = pMVar2;
  }
  __s->nMapSize = 4 << ((byte)__s->nMems & 0x1f);
  ppMVar1 = (Mem_Fixed_t **)malloc((long)(__s->nMapSize + 1) << 3);
  __s->pMap = ppMVar1;
  *__s->pMap = (Mem_Fixed_t *)0x0;
  for (local_20 = 1; local_20 < 5; local_20 = local_20 + 1) {
    __s->pMap[local_20] = *__s->pMems;
  }
  for (local_1c = 0; local_1c < __s->nMems; local_1c = local_1c + 1) {
    local_20 = 4 << ((byte)local_1c & 0x1f);
    while (local_20 = local_20 + 1, local_20 <= 8 << ((byte)local_1c & 0x1f)) {
      __s->pMap[local_20] = __s->pMems[local_1c];
    }
  }
  return __s;
}

Assistant:

Mem_Step_t * Mem_StepStart( int nSteps )
{
    Mem_Step_t * p;
    int i, k;
    p = ABC_ALLOC( Mem_Step_t, 1 );
    memset( p, 0, sizeof(Mem_Step_t) );
    p->nMems = nSteps;
    // start the fixed memory managers
    p->pMems = ABC_ALLOC( Mem_Fixed_t *, p->nMems );
    for ( i = 0; i < p->nMems; i++ )
        p->pMems[i] = Mem_FixedStart( (8<<i) );
    // set up the mapping of the required memory size into the corresponding manager
    p->nMapSize = (4<<p->nMems);
    p->pMap = ABC_ALLOC( Mem_Fixed_t *, p->nMapSize+1 );
    p->pMap[0] = NULL;
    for ( k = 1; k <= 4; k++ )
        p->pMap[k] = p->pMems[0];
    for ( i = 0; i < p->nMems; i++ )
        for ( k = (4<<i)+1; k <= (8<<i); k++ )
            p->pMap[k] = p->pMems[i];
//for ( i = 1; i < 100; i ++ )
//printf( "%10d: size = %10d\n", i, p->pMap[i]->nEntrySize );
    return p;
}